

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.h
# Opt level: O0

string * __thiscall MinVR::VRDisplayNode::getName_abi_cxx11_(VRDisplayNode *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x20));
  return in_RDI;
}

Assistant:

virtual std::string getName() const { return _name; }